

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

void __thiscall DataRefs::dataRefDefinitionT::setData(dataRefDefinitionT *this,string *s)

{
  int iVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  char *in_RAX;
  int *piVar5;
  long lVar6;
  LTError *this_00;
  long *plVar7;
  undefined8 uVar8;
  float f;
  undefined1 auVar9 [12];
  char *local_38;
  
  local_38 = in_RAX;
  if (this->dataType == 2) {
    pcVar2 = (s->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    f = strtof(pcVar2,&local_38);
    if (local_38 != pcVar2) {
      if (*piVar5 != 0) {
        if (*piVar5 != 0x22) goto LAB_00131ad7;
        f = (float)std::__throw_out_of_range("stof");
      }
      *piVar5 = iVar1;
LAB_00131ad7:
      setData(this,f);
      return;
    }
    std::__throw_invalid_argument("stof");
  }
  else {
    if (this->dataType != 1) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
                       ,0x7cc,"setData",logFATAL,"ASSERT FAILED: %s","NULL");
      __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
    }
    pcVar2 = (s->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(pcVar2,&local_38,10);
    if (local_38 != pcVar2) {
      if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        setData(this,(int)lVar6);
        return;
      }
      goto LAB_00131b64;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00131b64:
  auVar9 = std::__throw_out_of_range("stoi");
  uVar8 = auVar9._0_8_;
  __cxa_free_exception(piVar5);
  if (auVar9._8_4_ == 2) {
    plVar7 = (long *)__cxa_begin_catch(uVar8);
    if ((int)dataRefs.iLogLevel < 3) {
      pcVar3 = (this->dataName)._M_dataplus._M_p;
      pcVar4 = (s->_M_dataplus)._M_p;
      uVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,2000,"setData",logWARN,"%s: Could not convert \'%s\' to a number: %s",pcVar3,pcVar4,
             uVar8);
    }
  }
  else {
    if (auVar9._8_4_ != 1) {
      _Unwind_Resume(uVar8);
    }
    plVar7 = (long *)__cxa_begin_catch(uVar8);
    if ((int)dataRefs.iLogLevel < 3) {
      pcVar3 = (this->dataName)._M_dataplus._M_p;
      pcVar4 = (s->_M_dataplus)._M_p;
      uVar8 = (**(code **)(*plVar7 + 0x10))(plVar7);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x7d3,"setData",logWARN,"%s: Could not convert \'%s\' to a number: %s",pcVar3,pcVar4,
             uVar8);
    }
  }
  __cxa_end_catch();
  return;
}

Assistant:

void DataRefs::dataRefDefinitionT::setData (const std::string& s)
{
    try {
        switch (dataType) {
            case xplmType_Int:
                setData (std::stoi(s));
                break;
            case xplmType_Float:
                setData (std::stof(s));
                break;
            default:
                // else: must not happen
                LOG_ASSERT(NULL);
        }
    }
    catch (const std::invalid_argument& e) {
        LOG_MSG(logWARN,ERR_CFG_FILE_VALUE,dataName.c_str(),s.c_str(),e.what());
    }
    catch (const std::out_of_range& e) {
        LOG_MSG(logWARN,ERR_CFG_FILE_VALUE,dataName.c_str(),s.c_str(),e.what());
    }
}